

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_memory_log_store.cxx
# Opt level: O2

ulong __thiscall nuraft::inmem_log_store::append(inmem_log_store *this,ptr<log_entry> *entry)

{
  mapped_type mVar1;
  __shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2> *this_00;
  uint64_t uVar2;
  mapped_type *pmVar3;
  size_t idx;
  ptr<log_entry> clone;
  mapped_type local_38;
  __shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2> local_30;
  key_type local_20;
  
  make_clone((ptr<log_entry> *)&local_30);
  std::mutex::lock(&this->logs_lock_);
  local_38 = ((this->start_idx_).super___atomic_base<unsigned_long>._M_i +
             (this->logs_)._M_t._M_impl.super__Rb_tree_header._M_node_count) - 1;
  this_00 = &std::
             map<unsigned_long,_std::shared_ptr<nuraft::log_entry>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<nuraft::log_entry>_>_>_>
             ::operator[](&this->logs_,&local_38)->
             super___shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<nuraft::log_entry,_(__gnu_cxx::_Lock_policy)2>::operator=(this_00,&local_30);
  if ((this->disk_emul_delay).super___atomic_base<unsigned_long>._M_i != 0) {
    uVar2 = timer_helper::get_timeofday_us();
    mVar1 = local_38;
    local_20 = (this->disk_emul_delay).super___atomic_base<unsigned_long>._M_i * 1000 + uVar2;
    pmVar3 = std::
             map<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>
             ::operator[](&this->disk_emul_logs_being_written_,&local_20);
    *pmVar3 = mVar1;
    EventAwaiter::invoke(&this->disk_emul_ea_);
  }
  mVar1 = local_38;
  pthread_mutex_unlock((pthread_mutex_t *)&this->logs_lock_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_30._M_refcount);
  return mVar1;
}

Assistant:

ulong inmem_log_store::append(ptr<log_entry>& entry) {
    ptr<log_entry> clone = make_clone(entry);

    std::lock_guard<std::mutex> l(logs_lock_);
    size_t idx = start_idx_ + logs_.size() - 1;
    logs_[idx] = clone;

    if (disk_emul_delay) {
        uint64_t cur_time = timer_helper::get_timeofday_us();
        disk_emul_logs_being_written_[cur_time + disk_emul_delay * 1000] = idx;
        disk_emul_ea_.invoke();
    }

    return idx;
}